

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aipc.c
# Opt level: O2

void nn_aipc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int *self_00;
  nn_ep *self_01;
  int errnum;
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  undefined8 uVar4;
  int val;
  size_t sz;
  
  uVar3 = (ulong)(uint)src;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) {
        nn_usock_accept((nn_usock *)&self[1].state,(nn_usock *)self[8].shutdown_fn);
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected action";
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0xaf;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected source";
      uVar4 = 0xb3;
    }
    break;
  case 2:
    if (src == 3) {
      if (type == 6) {
        self_01 = (nn_ep *)self[1].shutdown_fn;
        errnum = nn_usock_geterrno((nn_usock *)self[8].shutdown_fn);
        nn_ep_set_error(self_01,errnum);
        nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0x6b,1);
        nn_usock_accept((nn_usock *)&self[1].state,(nn_usock *)self[8].shutdown_fn);
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected action";
      uVar3 = 3;
      uVar4 = 0xed;
    }
    else if (src == 1) {
      if (type == 2) {
        nn_ep_clear_error((nn_ep *)self[1].shutdown_fn);
        sz = 4;
        nn_ep_getopt((nn_ep *)self[1].shutdown_fn,0,2,&val,&sz);
        if (sz == 4) {
          self_00 = &self[1].state;
          nn_usock_setsockopt((nn_usock *)self_00,1,7,&val,4);
          sz = 4;
          nn_ep_getopt((nn_ep *)self[1].shutdown_fn,0,3,&val,&sz);
          if (sz == 4) {
            nn_usock_setsockopt((nn_usock *)self_00,1,8,&val,4);
            nn_usock_swap_owner((nn_usock *)self[8].shutdown_fn,(nn_fsm_owner *)&self[8].state);
            self[8].shutdown_fn = (nn_fsm_fn)0x0;
            self[8].state = -1;
            self[8].srcptr = (void *)0x0;
            nn_fsm_raise(self,(nn_fsm_event *)&self[0x13].stopped.type,0x85b7);
            nn_usock_activate((nn_usock *)self_00);
            nn_sipc_start((nn_sipc *)&self[8].owner,(nn_usock *)self_00);
            *(undefined4 *)&self[1].fn = 3;
            nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0x66,1);
            return;
          }
          nn_backtrace_print();
          uVar4 = 0xca;
        }
        else {
          nn_backtrace_print();
          uVar4 = 0xc5;
        }
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/aipc.c"
                ,uVar4);
        goto LAB_001bd308;
      }
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected action";
      uVar3 = 1;
      uVar4 = 0xe0;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected source";
      uVar4 = 0xf1;
    }
    break;
  case 3:
    if (src == 2) {
      if (type == 1) {
        nn_sipc_stop((nn_sipc *)&self[8].owner);
        *(undefined4 *)&self[1].fn = 4;
        nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0x68,1);
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected action";
      uVar3 = 2;
      uVar4 = 0x102;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected source";
      uVar4 = 0x106;
    }
    break;
  case 4:
    if (src == 2) {
      if (type == 8) {
        return;
      }
      if (type == 2) {
        nn_usock_stop((nn_usock *)&self[1].state);
        *(undefined4 *)&self[1].fn = 5;
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected action";
      uVar3 = 2;
      uVar4 = 0x118;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected source";
      uVar4 = 0x11c;
    }
    break;
  case 5:
    if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 7) {
        nn_fsm_raise(self,(nn_fsm_event *)&self[0x14].srcptr,0x85b8);
        *(undefined4 *)&self[1].fn = 6;
        return;
      }
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected action";
      uVar3 = 1;
      uVar4 = 0x12e;
    }
    else {
      nn_backtrace_print();
      uVar1 = (ulong)*(uint *)&self[1].fn;
      pcVar2 = "Unexpected source";
      uVar4 = 0x132;
    }
    break;
  default:
    nn_backtrace_print();
    uVar1 = (ulong)*(uint *)&self[1].fn;
    pcVar2 = "Unexpected state";
    uVar4 = 0x139;
  }
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar2,uVar1,uVar3,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/aipc.c"
          ,uVar4);
LAB_001bd308:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_aipc_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_aipc *aipc;
    int val;
    size_t sz;

    aipc = nn_cont (self, struct nn_aipc, fsm);

    switch (aipc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The state machine wasn't yet started.                                     */
/******************************************************************************/
    case NN_AIPC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_usock_accept (&aipc->usock, aipc->listener);
                aipc->state = NN_AIPC_STATE_ACCEPTING;
                return;
            default:
                nn_fsm_bad_action (aipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (aipc->state, src, type);
        }

/******************************************************************************/
/*  ACCEPTING state.                                                          */
/*  Waiting for incoming connection.                                          */
/******************************************************************************/
    case NN_AIPC_STATE_ACCEPTING:
        switch (src) {

        case NN_AIPC_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ACCEPTED:
                nn_ep_clear_error (aipc->ep);

                /*  Set the relevant socket options. */
                sz = sizeof (val);
                nn_ep_getopt (aipc->ep, NN_SOL_SOCKET, NN_SNDBUF, &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&aipc->usock, SOL_SOCKET, SO_SNDBUF,
                    &val, sizeof (val));
                sz = sizeof (val);
                nn_ep_getopt (aipc->ep, NN_SOL_SOCKET, NN_RCVBUF, &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&aipc->usock, SOL_SOCKET, SO_RCVBUF,
                    &val, sizeof (val));

                /*  Return ownership of the listening socket to the parent. */
                nn_usock_swap_owner (aipc->listener, &aipc->listener_owner);
                aipc->listener = NULL;
                aipc->listener_owner.src = -1;
                aipc->listener_owner.fsm = NULL;
                nn_fsm_raise (&aipc->fsm, &aipc->accepted, NN_AIPC_ACCEPTED);

                /*  Start the sipc state machine. */
                nn_usock_activate (&aipc->usock);
                nn_sipc_start (&aipc->sipc, &aipc->usock);
                aipc->state = NN_AIPC_STATE_ACTIVE;

                nn_ep_stat_increment (aipc->ep,
                    NN_STAT_ACCEPTED_CONNECTIONS, 1);

                return;

            default:
                nn_fsm_bad_action (aipc->state, src, type);
            }

        case NN_AIPC_SRC_LISTENER:
            switch (type) {
            case NN_USOCK_ACCEPT_ERROR:
                nn_ep_set_error (aipc->ep, nn_usock_geterrno (aipc->listener));
                nn_ep_stat_increment (aipc->ep, NN_STAT_ACCEPT_ERRORS, 1);
                nn_usock_accept (&aipc->usock, aipc->listener);

                return;

            default:
                nn_fsm_bad_action (aipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (aipc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_AIPC_STATE_ACTIVE:
        switch (src) {

        case NN_AIPC_SRC_SIPC:
            switch (type) {
            case NN_SIPC_ERROR:
                nn_sipc_stop (&aipc->sipc);
                aipc->state = NN_AIPC_STATE_STOPPING_SIPC;
                nn_ep_stat_increment (aipc->ep, NN_STAT_BROKEN_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (aipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (aipc->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_SIPC state.                                                      */
/******************************************************************************/
    case NN_AIPC_STATE_STOPPING_SIPC:
        switch (src) {

        case NN_AIPC_SRC_SIPC:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_SIPC_STOPPED:
                nn_usock_stop (&aipc->usock);
                aipc->state = NN_AIPC_STATE_STOPPING_USOCK;
                return;
            default:
                nn_fsm_bad_action (aipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (aipc->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_USOCK state.                                                      */
/******************************************************************************/
    case NN_AIPC_STATE_STOPPING_USOCK:
        switch (src) {

        case NN_AIPC_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_fsm_raise (&aipc->fsm, &aipc->done, NN_AIPC_ERROR);
                aipc->state = NN_AIPC_STATE_DONE;
                return;
            default:
                nn_fsm_bad_action (aipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (aipc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (aipc->state, src, type);
    }
}